

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O2

ControlledPollAction __thiscall
aeron::archive::RecordingDescriptorPoller::onFragment
          (RecordingDescriptorPoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  int32_t *piVar1;
  ushort uVar2;
  long __args;
  long __args_1;
  long __args_3;
  long __args_4;
  Value VVar3;
  ArchiveException *pAVar4;
  char *pcVar5;
  uint64_t offset_00;
  allocator local_1b2;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  long local_118;
  long local_110;
  ControlResponse msg;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  MessageHeader hdr;
  
  hdr.m_buffer = (char *)0x0;
  hdr.m_offset = 0;
  offset_00 = (uint64_t)offset;
  io::aeron::archive::codecs::MessageHeader::reset
            (&hdr,(char *)buffer->m_buffer,offset_00,(long)(int)buffer->m_length,0);
  uVar2 = *(ushort *)(hdr.m_buffer + hdr.m_offset + 2);
  if (uVar2 == 0x16) {
    msg.m_offset = 0;
    msg.m_buffer = (char *)0x0;
    msg.m_bufferLength = 0;
    io::aeron::archive::codecs::RecordingDescriptor::reset
              ((RecordingDescriptor *)&msg,(char *)buffer->m_buffer,offset_00 + 8,
               (long)(int)buffer->m_length,(ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset),
               (ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset + 6));
    __args = this->controlSessionId_;
    if ((__args == *(long *)(msg.m_buffer + msg.m_offset)) &&
       (__args_1 = this->correlationId_, __args_1 == *(long *)(msg.m_buffer + msg.m_offset + 8))) {
      local_148 = *(long *)(msg.m_buffer + msg.m_offset + 0x10);
      __args_3 = *(long *)(msg.m_buffer + msg.m_offset + 0x18);
      __args_4 = *(long *)(msg.m_buffer + msg.m_offset + 0x20);
      local_110 = *(long *)(msg.m_buffer + msg.m_offset + 0x28);
      local_118 = *(long *)(msg.m_buffer + msg.m_offset + 0x30);
      local_120 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x38);
      local_128 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x3c);
      local_130 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x40);
      local_138 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x44);
      local_140 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x48);
      local_150 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x4c);
      io::aeron::archive::codecs::RecordingDescriptor::getStrippedChannelAsString_abi_cxx11_
                (&local_190,(RecordingDescriptor *)&msg);
      io::aeron::archive::codecs::RecordingDescriptor::getOriginalChannelAsString_abi_cxx11_
                (&local_1b0,(RecordingDescriptor *)&msg);
      io::aeron::archive::codecs::RecordingDescriptor::getSourceIdentityAsString_abi_cxx11_
                (&local_170,(RecordingDescriptor *)&msg);
      std::
      function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->consumer_,__args,__args_1,local_148,__args_3,__args_4,local_110,local_118,
                   (int)local_120,(int)local_128,(int)local_130,(int)local_138,(int)local_140,
                   (int)local_150,&local_190,&local_1b0,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      piVar1 = &this->remainingRecordCount_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) goto LAB_001471d0;
    }
  }
  else {
    if (uVar2 != 1) {
      pAVar4 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_190,(uint)uVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     "unknown template id: ",&local_190);
      std::__cxx11::string::string
                ((string *)&local_1b0,
                 "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,(allocator *)&local_b0);
      pcVar5 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                         );
      std::__cxx11::string::string((string *)&local_170,pcVar5,(allocator *)&local_d0);
      ArchiveException::ArchiveException(pAVar4,(string *)&msg,&local_1b0,&local_170,0x62);
      __cxa_throw(pAVar4,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    msg.m_offset = 0;
    msg.m_buffer = (char *)0x0;
    msg.m_bufferLength = 0;
    io::aeron::archive::codecs::ControlResponse::reset
              (&msg,(char *)buffer->m_buffer,offset_00 + 8,(long)(int)buffer->m_length,
               (ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset),
               (ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset + 6));
    if (this->controlSessionId_ == *(long *)(msg.m_buffer + msg.m_offset)) {
      VVar3 = io::aeron::archive::codecs::ControlResponse::code(&msg);
      if ((VVar3 == RECORDING_UNKNOWN) &&
         (this->correlationId_ == *(long *)(msg.m_buffer + msg.m_offset + 8))) {
LAB_001471d0:
        this->isDispatchComplete_ = true;
        return BREAK;
      }
      if (VVar3 == ERROR) {
        pAVar4 = (ArchiveException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_b0,this->correlationId_);
        std::operator+(&local_170,"response for correlationId=",&local_b0);
        std::operator+(&local_1b0,&local_170,", error: ");
        io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                  (&local_d0,&msg);
        std::operator+(&local_190,&local_1b0,&local_d0);
        std::__cxx11::string::string
                  ((string *)&local_70,
                   "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                   ,&local_1b1);
        pcVar5 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                           );
        std::__cxx11::string::string((string *)&local_90,pcVar5,&local_1b2);
        ArchiveException::ArchiveException(pAVar4,&local_190,&local_70,&local_90,0x4e);
        __cxa_throw(pAVar4,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
    }
  }
  return CONTINUE;
}

Assistant:

ControlledPollAction RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                           util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId()) {
            auto code = msg.code();
            const std::int64_t correlationId = msg.correlationId();

            if (code == codecs::ControlResponseCode::RECORDING_UNKNOWN &&
                correlationId_ == correlationId) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            } else if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException(
                    "response for correlationId=" + std::to_string(correlationId_) +
                    ", error: " + msg.getErrorMessageAsString(), SOURCEINFO);
            }
        }
    } else if (templateId == codecs::RecordingDescriptor::sbeTemplateId()) {
        codecs::RecordingDescriptor msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId() && correlationId_ == msg.correlationId()) {
            consumer_(controlSessionId_, correlationId_, msg.recordingId(), msg.startTimestamp(), msg.stopTimestamp(),
                      msg.startPosition(), msg.stopPosition(), msg.initialTermId(), msg.segmentFileLength(),
                      msg.termBufferLength(), msg.mtuLength(), msg.sessionId(), msg.streamId(), msg.getStrippedChannelAsString(),
                      msg.getOriginalChannelAsString(), msg.getSourceIdentityAsString());

            if (--remainingRecordCount_ == 0) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            }
        }
    } else {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    return ControlledPollAction::CONTINUE;
}